

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int tonum(lua_State *L,int arg)

{
  int iVar1;
  char *pcVar2;
  bool local_31;
  char *s;
  size_t len;
  lua_State *plStack_18;
  int arg_local;
  lua_State *L_local;
  
  len._4_4_ = arg;
  plStack_18 = L;
  iVar1 = lua_type(L,arg);
  if (iVar1 == 3) {
    lua_pushvalue(plStack_18,len._4_4_);
    L_local._4_4_ = 1;
  }
  else {
    pcVar2 = lua_tolstring(plStack_18,len._4_4_,(size_t *)&s);
    local_31 = false;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (char *)lua_stringtonumber(plStack_18,pcVar2);
      local_31 = pcVar2 == s + 1;
    }
    L_local._4_4_ = (uint)local_31;
  }
  return L_local._4_4_;
}

Assistant:

static int tonum (lua_State *L, int arg) {
  if (lua_type(L, arg) == LUA_TNUMBER) {  /* already a number? */
    lua_pushvalue(L, arg);
    return 1;
  }
  else {  /* check whether it is a numerical string */
    size_t len;
    const char *s = lua_tolstring(L, arg, &len);
    return (s != NULL && lua_stringtonumber(L, s) == len + 1);
  }
}